

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint uVar3;
  DecodeStatus DVar4;
  uint64_t in_RCX;
  void *in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint Rt;
  uint Rn;
  DecodeStatus S;
  void *in_stack_ffffffffffffffb8;
  uint64_t in_stack_ffffffffffffffc0;
  DecodeStatus DVar5;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  DVar5 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  RegNo = fieldFromInstruction_4(in_ESI,0xc,4);
  fieldFromInstruction_4(in_ESI,0,8);
  if (uVar2 == 0xf) {
    uVar3 = MCInst_getOpcode(in_RDI);
    switch(uVar3) {
    case 0x94a:
      MCInst_setOpcode(in_RDI,0x94f);
      uVar3 = (uint)((ulong)in_RDI >> 0x20);
      break;
    default:
      return MCDisassembler_Fail;
    case 0x959:
      MCInst_setOpcode(in_RDI,0x95e);
      uVar3 = (uint)((ulong)in_RDI >> 0x20);
      break;
    case 0x961:
      MCInst_setOpcode(in_RDI,0x966);
      uVar3 = (uint)((ulong)in_RDI >> 0x20);
      break;
    case 0x969:
      MCInst_setOpcode(in_RDI,0x96e);
      uVar3 = (uint)((ulong)in_RDI >> 0x20);
      break;
    case 0x971:
      MCInst_setOpcode(in_RDI,0x976);
      uVar3 = (uint)((ulong)in_RDI >> 0x20);
    }
    DVar5 = DecodeT2LoadLabel((MCInst *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar3,
                              CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  }
  else {
    DVar4 = DecoderGPRRegisterClass
                      ((MCInst *)CONCAT44(DVar5,uVar2),RegNo,in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8);
    uVar3 = (uint)((ulong)in_RDX >> 0x20);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
    if (_Var1) {
      DVar4 = DecodeT2AddrModeImm8
                        ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar3,in_RCX,
                         (void *)CONCAT44(DVar5,uVar2));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
      if (!_Var1) {
        DVar5 = MCDisassembler_Fail;
      }
    }
    else {
      DVar5 = MCDisassembler_Fail;
    }
  }
  return DVar5;
}

Assistant:

static DecodeStatus DecodeT2LoadT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	imm |= (Rn << 9);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRT:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBT:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHT:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSBT:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSHT:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}